

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O2

void __thiscall adios2::transport::FileStdio::Seek(FileStdio *this,size_t start)

{
  int iVar1;
  allocator local_f3;
  allocator local_f2;
  allocator local_f1;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  string local_30;
  
  if (start != 0xffffffffffffffff) {
    WaitForOpen(this);
    iVar1 = fseek((FILE *)this->m_File,0,0);
    if (iVar1 == -1) {
      std::__cxx11::string::string((string *)&local_30,"Toolkit",&local_f1);
      std::__cxx11::string::string((string *)&local_50,"transport::file::FileStdio",&local_f2);
      std::__cxx11::string::string((string *)&local_70,"Seek",&local_f3);
      std::__cxx11::to_string(&local_f0,start);
      std::operator+(&local_d0,"couldn\'t seek to offset ",&local_f0);
      std::operator+(&local_b0,&local_d0," of file ");
      std::operator+(&local_90,&local_b0,&(this->super_Transport).m_Name);
      helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_30,&local_50,&local_70,&local_90,-1);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
    }
    return;
  }
  SeekToEnd(this);
  return;
}

Assistant:

void FileStdio::Seek(const size_t start)
{
    if (start != MaxSizeT)
    {
        WaitForOpen();
        const auto status = std::fseek(m_File, 0, SEEK_SET);
        if (status == -1)
        {
            helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "Seek",
                                                  "couldn't seek to offset " +
                                                      std::to_string(start) + " of file " + m_Name);
        }
    }
    else
    {
        SeekToEnd();
    }
}